

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP4Serializer::SerializeMetadataInData
          (BP4Serializer *this,bool updateAbsolutePosition,bool inData)

{
  vector<char,_std::allocator<char>_> *buffer;
  code *position;
  code *pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _func_int *p_Var4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  size_t sVar9;
  _func_int *p_Var10;
  uint64_t pgIndexStart;
  long lVar11;
  size_t __n;
  undefined8 *puVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  string local_50;
  
  p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
  lVar14 = 0;
  for (puVar12 = *(undefined8 **)(&(this->super_BP4Base).field_0x138 + (long)p_Var4);
      puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)*puVar12) {
    lVar14 = lVar14 + (puVar12[6] - puVar12[5]);
  }
  lVar15 = 0;
  for (puVar12 = *(undefined8 **)(&(this->super_BP4Base).field_0x170 + (long)p_Var4);
      puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)*puVar12) {
    lVar15 = lVar15 + (puVar12[6] - puVar12[5]);
  }
  if (inData) {
    lVar5 = *(long *)(&(this->super_BP4Base).field_0xe8 + (long)p_Var4);
    lVar6 = *(long *)(&(this->super_BP4Base).field_0xf0 + (long)p_Var4);
    uVar7 = *(undefined8 *)(&(this->super_BP4Base).field_0x1a0 + (long)p_Var4);
    __n = lVar6 - lVar5;
    uVar2 = *(undefined4 *)(&(this->super_BP4Base).field_0x140 + (long)p_Var4);
    uVar3 = *(undefined4 *)(&(this->super_BP4Base).field_0x178 + (long)p_Var4);
    lVar11 = (ulong)*(uint *)(&(this->super_BP4Base).field_0x198 + (long)p_Var4) +
             __n + lVar14 + lVar15 + 0x28;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    lVar8 = *(long *)(p_Var4 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50," when writing metadata in bp data buffer","");
    BufferSTL::Resize((BufferSTL *)
                      (p_Var4 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h),
                      lVar8 + lVar11,&local_50);
    buffer = (vector<char,_std::allocator<char>_> *)
             (p_Var4 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    position = p_Var4 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    *(undefined8 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + *(size_t *)position) = uVar7;
    sVar9 = *(size_t *)position;
    *(size_t *)position = sVar9 + 8;
    *(size_t *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar9 + 8) = __n;
    sVar9 = *(size_t *)position;
    *(size_t *)position = sVar9 + 8;
    if (lVar6 != lVar5) {
      memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar9 + 8,
              *(void **)(&(this->super_BP4Base).field_0xe8 +
                        (long)(this->super_BP4Base)._vptr_BP4Base[-3]),__n);
    }
    sVar9 = *(size_t *)position;
    *(size_t *)position = sVar9 + __n;
    p_Var10 = (this->super_BP4Base)._vptr_BP4Base[-3];
    *(undefined4 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + sVar9 + __n) = uVar2;
    sVar9 = *(size_t *)position;
    *(size_t *)position = sVar9 + 4;
    *(long *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar9 + 4) = lVar14;
    *(size_t *)position = *(size_t *)position + 8;
    for (puVar12 = *(undefined8 **)(&(this->super_BP4Base).field_0x138 + (long)p_Var10);
        puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)*puVar12) {
      sVar13 = puVar12[6] - (long)puVar12[5];
      if (sVar13 != 0) {
        memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + *(size_t *)position,(void *)puVar12[5],sVar13);
      }
      *(size_t *)position = *(size_t *)position + sVar13;
    }
    p_Var10 = (this->super_BP4Base)._vptr_BP4Base[-3];
    *(undefined4 *)
     ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start + *(size_t *)position) = uVar3;
    sVar9 = *(size_t *)position;
    *(size_t *)position = sVar9 + 4;
    *(long *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start + sVar9 + 4) = lVar15;
    *(size_t *)position = *(size_t *)position + 8;
    pcVar1 = p_Var4 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer;
    for (puVar12 = *(undefined8 **)(&(this->super_BP4Base).field_0x170 + (long)p_Var10);
        puVar12 != (undefined8 *)0x0; puVar12 = (undefined8 *)*puVar12) {
      sVar13 = puVar12[6] - (long)puVar12[5];
      if (sVar13 != 0) {
        memmove((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + *(size_t *)position,(void *)puVar12[5],sVar13);
      }
      *(size_t *)position = *(size_t *)position + sVar13;
    }
    pgIndexStart = *(uint64_t *)pcVar1;
    BPSerializer::PutMinifooter
              ((BPSerializer *)&(this->super_BP4Base).field_0xa0,pgIndexStart,
               __n + pgIndexStart + 0x10,lVar14 + __n + pgIndexStart + 0x1c,buffer,
               (size_t *)position,false);
    if (updateAbsolutePosition) {
      *(uint64_t *)pcVar1 = *(uint64_t *)pcVar1 + lVar11;
    }
    p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
    if ((&(this->super_BP4Base).field_0x2e8)[(long)p_Var4] == '\x01') {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<char_const(&)[10],unsigned_long&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(&(this->super_BP4Base).field_0x2b0 + (long)p_Var4),"buffering",pcVar1);
    }
  }
  return;
}

Assistant:

void BP4Serializer::SerializeMetadataInData(const bool updateAbsolutePosition, const bool inData)
{
    auto lf_SetIndexCountLength = [](std::unordered_map<std::string, SerialElementIndex> &indices,
                                     uint32_t &count, uint64_t &length) {
        count = static_cast<uint32_t>(indices.size());
        length = 0;
        for (auto &indexPair : indices) // set each index length
        {
            auto &indexBuffer = indexPair.second.Buffer;
            // const uint32_t indexLength =
            //     static_cast<uint32_t>(indexBuffer.size() - 4);
            // size_t indexLengthPosition = 0;
            // helper::CopyToBuffer(indexBuffer, indexLengthPosition,
            //                      &indexLength);

            length += indexBuffer.size(); // overall length
        }
    };

    auto lf_FlattenIndices = [](const uint32_t count, const uint64_t length,
                                const std::unordered_map<std::string, SerialElementIndex> &indices,
                                std::vector<char> &buffer, size_t &position) {
        helper::CopyToBuffer(buffer, position, &count);
        helper::CopyToBuffer(buffer, position, &length);

        for (const auto &indexPair : indices) // set each index length
        {
            const auto &indexBuffer = indexPair.second.Buffer;
            helper::CopyToBuffer(buffer, position, indexBuffer.data(), indexBuffer.size());
        }
    };

    // Finish writing metadata counts and lengths
    // PG Index
    const uint64_t pgCount = m_MetadataSet.DataPGCount;
    const uint64_t pgLength = m_MetadataSet.PGIndex.Buffer.size();

    // var index count and length (total), and each index length
    uint32_t varsCount = 0;
    uint64_t varsLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.VarsIndices, varsCount, varsLength);

    // attribute index count and length, and each index length
    uint32_t attributesCount = 0;
    uint64_t attributesLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.AttributesIndices, attributesCount, attributesLength);

    if (!inData)
    {
        return;
    }

    const size_t footerSize =
        static_cast<size_t>((pgLength + 16) + (varsLength + 12) + (attributesLength + 12) +
                            m_MetadataSet.MiniFooterSize);

    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // reserve data to fit metadata,
    // must replace with growth buffer strategy?
    m_Data.Resize(position + footerSize, " when writing metadata in bp data buffer");

    // write pg index
    helper::CopyToBuffer(buffer, position, &pgCount);
    helper::CopyToBuffer(buffer, position, &pgLength);
    helper::CopyToBuffer(buffer, position, m_MetadataSet.PGIndex.Buffer.data(),
                         static_cast<size_t>(pgLength));

    // Vars indices
    lf_FlattenIndices(varsCount, varsLength, m_MetadataSet.VarsIndices, buffer, position);
    // Attribute indices
    lf_FlattenIndices(attributesCount, attributesLength, m_MetadataSet.AttributesIndices, buffer,
                      position);

    // getting absolute offset start, minifooter is 28 bytes for now
    const uint64_t pgIndexStart = static_cast<uint64_t>(absolutePosition);
    const uint64_t variablesIndexStart = static_cast<uint64_t>(pgIndexStart + (pgLength + 16));
    const uint64_t attributesIndexStart =
        static_cast<uint64_t>(variablesIndexStart + (varsLength + 12));

    PutMinifooter(pgIndexStart, variablesIndexStart, attributesIndexStart, buffer, position);

    if (updateAbsolutePosition)
    {
        absolutePosition += footerSize;
    }

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.emplace("buffering", absolutePosition);
    }
}